

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::Y_formatter<spdlog::details::null_scoped_padder>::format
          (Y_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar5;
  format_int fStack_48;
  
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar4 = fmt::v6::format_int::format_decimal(&fStack_48,(ulong)uVar3);
  fStack_48.str_ = pcVar4;
  if (iVar2 < -0x76c) {
    fStack_48.str_ = pcVar4 + -1;
    pcVar4[-1] = '-';
  }
  pcVar4 = fStack_48.str_;
  __n = (long)(fStack_48.buffer_ + 0x15) - (long)fStack_48.str_;
  uVar5 = (dest->super_buffer<char>).size_ + __n;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
  }
  if (fStack_48.buffer_ + 0x15 != pcVar4) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar4,__n);
  }
  (dest->super_buffer<char>).size_ = uVar5;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }